

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_init_eb2.cpp
# Opt level: O0

void __thiscall NavierStokesBase::initialize_eb2_structs(NavierStokesBase *this)

{
  int iVar1;
  EBCellFlag *pEVar2;
  EBCellFlagFab *pEVar3;
  BaseFab<int> *pBVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  FabFactory<amrex::FArrayBox> *pFVar11;
  MultiFab *pMVar12;
  MultiCutFab *pMVar13;
  long lVar14;
  long lVar15;
  Long LVar16;
  Box *pBVar17;
  IntVect *pIVar18;
  long in_RDI;
  EBCellFlag *flag_1;
  BoxIterator bit_1;
  EBCellFlag *flag;
  BoxIterator bit;
  int Ncut;
  Array4<int> *mask_1;
  Array4<int> *mask;
  FabType typ;
  EBCellFlagFab *flagfab;
  Box bx;
  Box tbox;
  BaseFab<int> *mfab;
  MFIter mfi;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *ebfactory;
  Long result_2;
  Long result_3;
  Long result_4;
  Long result_5;
  Long result;
  Long result_1;
  char (*in_stack_fffffffffffff518) [25];
  MFIter *mfi_00;
  AmrLevel *in_stack_fffffffffffff520;
  Print *in_stack_fffffffffffff528;
  Box *in_stack_fffffffffffff530;
  MFInfo *in_stack_fffffffffffff540;
  undefined1 do_tiling_;
  int in_stack_fffffffffffff548;
  int in_stack_fffffffffffff54c;
  int in_stack_fffffffffffff550;
  int in_stack_fffffffffffff554;
  BoxArray *in_stack_fffffffffffff558;
  int *piVar19;
  FabArray<amrex::BaseFab<int>_> *in_stack_fffffffffffff560;
  BaseFab<int> *in_stack_fffffffffffff568;
  Box *in_stack_fffffffffffff570;
  int in_stack_fffffffffffff580;
  int in_stack_fffffffffffff584;
  int *in_stack_fffffffffffff588;
  Print *in_stack_fffffffffffff590;
  Box *in_stack_fffffffffffff640;
  int in_stack_fffffffffffff648;
  int in_stack_fffffffffffff64c;
  BoxIterator local_7ac;
  EBCellFlag *local_788;
  BoxIterator local_780;
  int local_75c;
  undefined1 local_758 [64];
  undefined1 local_718 [64];
  undefined1 *local_6d8;
  undefined1 local_6d0 [64];
  undefined1 local_690 [64];
  undefined1 *local_650;
  FabType local_644;
  EBCellFlagFab *local_640;
  BaseFab<int> *local_600;
  undefined4 local_5f4;
  MFIter local_5f0;
  FabArray<amrex::EBCellFlagFab> *local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 local_560;
  long local_558;
  MFIter local_550 [4];
  undefined8 local_378;
  int local_36c;
  IntVect *local_368;
  EBCellFlagFab *local_360;
  int local_354;
  IntVect *local_350;
  EBCellFlagFab *local_348;
  EBCellFlag *local_340;
  EBCellFlag *local_338;
  EBCellFlag *local_330;
  EBCellFlag *local_328;
  EBCellFlag *local_320;
  EBCellFlag *local_318;
  IntVect *local_310;
  BaseFab<int> *local_308;
  IntVect *local_300;
  BaseFab<int> *local_2f8;
  IntVect *local_2f0;
  BaseFab<int> *local_2e8;
  IntVect *local_2e0;
  BaseFab<int> *local_2d8;
  long local_2d0;
  IntVect *local_2c8;
  Box *local_2c0;
  undefined4 local_2b4;
  Box *local_2b0;
  undefined4 local_2a4;
  IntVect *local_2a0;
  undefined4 local_294;
  Box *local_290;
  undefined4 local_284;
  IntVect *local_280;
  undefined4 local_274;
  Box *local_270;
  undefined4 local_264;
  IntVect *local_260;
  long local_258;
  IntVect *local_250;
  Box *local_248;
  undefined4 local_23c;
  Box *local_238;
  undefined4 local_22c;
  IntVect *local_228;
  undefined4 local_21c;
  Box *local_218;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  Box *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  long local_1e0;
  IntVect *local_1d8;
  Box *local_1d0;
  undefined4 local_1c4;
  Box *local_1c0;
  undefined4 local_1b4;
  IntVect *local_1b0;
  undefined4 local_1a4;
  Box *local_1a0;
  undefined4 local_194;
  IntVect *local_190;
  undefined4 local_184;
  Box *local_180;
  undefined4 local_174;
  IntVect *local_170;
  long local_168;
  IntVect *local_160;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  undefined4 local_13c;
  IntVect *local_138;
  undefined4 local_12c;
  Box *local_128;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  Box *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  long local_f0;
  IntVect *local_e8;
  Box *local_e0;
  undefined4 local_d4;
  Box *local_d0;
  undefined4 local_c4;
  IntVect *local_c0;
  undefined4 local_b4;
  Box *local_b0;
  undefined4 local_a4;
  IntVect *local_a0;
  undefined4 local_94;
  Box *local_90;
  undefined4 local_84;
  IntVect *local_80;
  long local_78;
  IntVect *local_70;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  amrex::OutStream();
  amrex::Print::Print((Print *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                      (ostream *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  amrex::Print::operator<<((Print *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  amrex::Print::operator<<
            ((Print *)in_stack_fffffffffffff520,
             (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
              *)in_stack_fffffffffffff518);
  amrex::Print::~Print(in_stack_fffffffffffff590);
  no_eb_in_domain = false;
  local_550[0].tile_size.vect[2] = 0;
  local_550[0].flags = '\0';
  local_550[0]._29_3_ = 0;
  local_550[0].currentIndex = 0;
  local_550[0].beginIndex = 0;
  local_550[0].fabArray = (FabArrayBase *)0x0;
  local_550[0].tile_size.vect[0] = 0;
  local_550[0].tile_size.vect[1] = 0;
  local_550[0].endIndex = 0;
  local_550[0].streams = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x49cd95);
  local_550[0].m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi_00 = local_550;
  amrex::DefaultFabFactory<amrex::BaseFab<int>_>::DefaultFabFactory
            ((DefaultFabFactory<amrex::BaseFab<int>_> *)in_stack_fffffffffffff520);
  amrex::FabArray<amrex::BaseFab<int>_>::define
            (in_stack_fffffffffffff560,in_stack_fffffffffffff558,
             (DistributionMapping *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
             in_stack_fffffffffffff54c,in_stack_fffffffffffff548,in_stack_fffffffffffff540,
             (FabFactory<amrex::BaseFab<int>_> *)in_stack_fffffffffffff570);
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff540 >> 0x38);
  amrex::DefaultFabFactory<amrex::BaseFab<int>_>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::BaseFab<int>_> *)0x49ce00);
  amrex::MFInfo::~MFInfo((MFInfo *)0x49ce0d);
  pFVar11 = amrex::AmrLevel::Factory(in_stack_fffffffffffff520);
  local_558 = __dynamic_cast(pFVar11,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_558 != 0) {
    pMVar12 = amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff520)
    ;
    *(MultiFab **)(in_RDI + 0x9c0) = pMVar12;
    pMVar13 = amrex::EBFArrayBoxFactory::getBndryCent
                        ((EBFArrayBoxFactory *)in_stack_fffffffffffff520);
    *(MultiCutFab **)(in_RDI + 0x9c8) = pMVar13;
    amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff520);
    *(undefined8 *)(in_RDI + 0xb50) = local_570;
    *(undefined8 *)(in_RDI + 0xb58) = local_568;
    *(undefined8 *)(in_RDI + 0xb60) = local_560;
    amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff520);
    *(undefined8 *)(in_RDI + 0xb68) = local_588;
    *(undefined8 *)(in_RDI + 0xb70) = local_580;
    *(undefined8 *)(in_RDI + 0xb78) = local_578;
    local_590 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff520);
    amrex::MFIter::MFIter
              ((MFIter *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
               (FabArrayBase *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
               (bool)do_tiling_);
    while (bVar5 = amrex::MFIter::isValid(&local_5f0), bVar5) {
      local_600 = amrex::FabArray<amrex::BaseFab<int>_>::operator[]
                            ((FabArray<amrex::BaseFab<int>_> *)in_stack_fffffffffffff520,mfi_00);
      amrex::MFIter::growntilebox
                ((MFIter *)in_stack_fffffffffffff590,(int)((ulong)in_stack_fffffffffffff588 >> 0x20)
                );
      amrex::MFIter::tilebox
                ((MFIter *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580));
      local_640 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                            ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff520,mfi_00);
      local_644 = amrex::EBCellFlagFab::getType
                            ((EBCellFlagFab *)
                             CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                             in_stack_fffffffffffff640);
      if (local_644 == regular) {
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  ((FabArray<amrex::BaseFab<int>_> *)in_stack_fffffffffffff528,
                   (MFIter *)in_stack_fffffffffffff520);
        local_650 = local_690;
        memcpy(local_6d0,local_650,0x3c);
        amrex::ParallelFor<NavierStokesBase::initialize_eb2_structs()::__0>
                  (in_stack_fffffffffffff570,(anon_class_64_1_898eb3ea *)in_stack_fffffffffffff568);
      }
      else if (local_644 == covered) {
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  ((FabArray<amrex::BaseFab<int>_> *)in_stack_fffffffffffff528,
                   (MFIter *)in_stack_fffffffffffff520);
        local_6d8 = local_718;
        memcpy(local_758,local_6d8,0x3c);
        amrex::ParallelFor<NavierStokesBase::initialize_eb2_structs()::__1>
                  (in_stack_fffffffffffff570,(anon_class_64_1_898eb3ea *)in_stack_fffffffffffff568);
      }
      else if (local_644 == singlevalued) {
        local_75c = 0;
        amrex::BoxIterator::BoxIterator((BoxIterator *)in_stack_fffffffffffff520,(Box *)mfi_00);
        while (bVar5 = amrex::BoxIterator::ok(&local_780), pEVar3 = local_640, bVar5) {
          local_350 = amrex::BoxIterator::operator()(&local_780);
          local_348 = pEVar3;
          local_354 = 0;
          pEVar2 = (pEVar3->super_BaseFab<amrex::EBCellFlag>).dptr;
          in_stack_fffffffffffff640 = &(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain;
          local_84 = 0;
          local_94 = 0;
          local_f0 = (long)(local_350->vect[0] - (in_stack_fffffffffffff640->smallend).vect[0]);
          local_e8 = local_350;
          local_e0 = in_stack_fffffffffffff640;
          local_90 = in_stack_fffffffffffff640;
          local_80 = local_350;
          iVar10 = amrex::Box::length(in_stack_fffffffffffff640,0);
          local_a0 = local_e8;
          local_a4 = 1;
          local_b4 = 1;
          in_stack_fffffffffffff64c =
               local_e8->vect[1] - (in_stack_fffffffffffff640->smallend).vect[1];
          local_c0 = local_e8;
          local_c4 = 2;
          local_d4 = 2;
          in_stack_fffffffffffff648 =
               local_e8->vect[2] - (in_stack_fffffffffffff640->smallend).vect[2];
          local_d0 = in_stack_fffffffffffff640;
          local_b0 = in_stack_fffffffffffff640;
          iVar6 = amrex::Box::length(in_stack_fffffffffffff640,1);
          lVar14 = iVar10 * (in_stack_fffffffffffff64c + in_stack_fffffffffffff648 * iVar6) +
                   local_f0;
          lVar15 = (long)local_354;
          local_f0 = lVar14;
          LVar16 = amrex::Box::numPts(in_stack_fffffffffffff530);
          local_788 = pEVar2 + lVar14 + lVar15 * LVar16;
          if (((local_788->flag & 3) != 0) && (local_318 = local_788, (local_788->flag & 3) != 3)) {
            local_75c = local_75c + 1;
          }
          local_330 = local_788;
          amrex::BoxIterator::operator++((BoxIterator *)0x49d465);
        }
        local_5f4 = 5;
        amrex::BoxIterator::~BoxIterator(&local_780);
        amrex::BoxIterator::BoxIterator((BoxIterator *)in_stack_fffffffffffff520,(Box *)mfi_00);
        while (bVar5 = amrex::BoxIterator::ok(&local_7ac), pEVar3 = local_640, bVar5) {
          local_368 = amrex::BoxIterator::operator()(&local_7ac);
          local_360 = pEVar3;
          local_36c = 0;
          pEVar2 = (pEVar3->super_BaseFab<amrex::EBCellFlag>).dptr;
          pBVar17 = &(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain;
          local_c = 0;
          local_1c = 0;
          local_78 = (long)(local_368->vect[0] - (pBVar17->smallend).vect[0]);
          local_70 = local_368;
          local_68 = pBVar17;
          local_18 = pBVar17;
          local_8 = local_368;
          iVar7 = amrex::Box::length(pBVar17,0);
          local_28 = local_70;
          local_2c = 1;
          iVar10 = local_70->vect[1];
          local_3c = 1;
          iVar6 = (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
          local_48 = local_70;
          local_4c = 2;
          iVar9 = local_70->vect[2];
          local_5c = 2;
          iVar1 = (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
          local_58 = pBVar17;
          local_38 = pBVar17;
          iVar8 = amrex::Box::length(pBVar17,1);
          lVar14 = iVar7 * ((iVar10 - iVar6) + (iVar9 - iVar1) * iVar8) + local_78;
          lVar15 = (long)local_36c;
          local_78 = lVar14;
          LVar16 = amrex::Box::numPts(in_stack_fffffffffffff530);
          local_338 = pEVar2 + lVar14 + lVar15 * LVar16;
          if (((local_338->flag & 3) == 0) || (local_320 = local_338, (local_338->flag & 3) == 3)) {
            local_340 = local_338;
            if ((local_338->flag & 3) == 0) {
              pBVar17 = amrex::BaseFab<int>::box(local_600);
              pIVar18 = amrex::BoxIterator::operator()(&local_7ac);
              bVar5 = amrex::Box::contains(pBVar17,pIVar18);
              pBVar4 = local_600;
              if (bVar5) {
                local_2f0 = amrex::BoxIterator::operator()(&local_7ac);
                local_2e8 = pBVar4;
                piVar19 = pBVar4->dptr;
                pBVar17 = &pBVar4->domain;
                local_1ec = 0;
                local_1fc = 0;
                local_258 = (long)(local_2f0->vect[0] - (pBVar17->smallend).vect[0]);
                local_250 = local_2f0;
                local_248 = pBVar17;
                local_1f8 = pBVar17;
                local_1e8 = local_2f0;
                iVar7 = amrex::Box::length(pBVar17,0);
                local_208 = local_250;
                local_20c = 1;
                iVar10 = local_250->vect[1];
                local_21c = 1;
                iVar6 = (pBVar4->domain).smallend.vect[1];
                local_228 = local_250;
                local_22c = 2;
                iVar9 = local_250->vect[2];
                local_23c = 2;
                iVar1 = (pBVar4->domain).smallend.vect[2];
                local_238 = pBVar17;
                local_218 = pBVar17;
                iVar8 = amrex::Box::length(pBVar17,1);
                local_258 = iVar7 * ((iVar10 - iVar6) + (iVar9 - iVar1) * iVar8) + local_258;
                piVar19[local_258] = 1;
              }
            }
            else {
              local_328 = local_338;
              if ((local_338->flag & 3) == 3) {
                in_stack_fffffffffffff590 = (Print *)amrex::BaseFab<int>::box(local_600);
                pIVar18 = amrex::BoxIterator::operator()(&local_7ac);
                bVar5 = amrex::Box::contains((Box *)in_stack_fffffffffffff590,pIVar18);
                if (bVar5) {
                  in_stack_fffffffffffff568 = local_600;
                  local_300 = amrex::BoxIterator::operator()(&local_7ac);
                  in_stack_fffffffffffff588 = in_stack_fffffffffffff568->dptr;
                  in_stack_fffffffffffff570 = &in_stack_fffffffffffff568->domain;
                  local_174 = 0;
                  local_184 = 0;
                  local_1e0 = (long)(local_300->vect[0] -
                                    (in_stack_fffffffffffff570->smallend).vect[0]);
                  local_2f8 = in_stack_fffffffffffff568;
                  local_1d8 = local_300;
                  local_1d0 = in_stack_fffffffffffff570;
                  local_180 = in_stack_fffffffffffff570;
                  local_170 = local_300;
                  in_stack_fffffffffffff584 = amrex::Box::length(in_stack_fffffffffffff570,0);
                  local_190 = local_1d8;
                  local_194 = 1;
                  local_1a4 = 1;
                  in_stack_fffffffffffff580 =
                       local_1d8->vect[1] - (in_stack_fffffffffffff570->smallend).vect[1];
                  local_1b0 = local_1d8;
                  local_1b4 = 2;
                  iVar10 = local_1d8->vect[2];
                  local_1c4 = 2;
                  iVar6 = (in_stack_fffffffffffff570->smallend).vect[2];
                  local_1c0 = in_stack_fffffffffffff570;
                  local_1a0 = in_stack_fffffffffffff570;
                  iVar9 = amrex::Box::length(in_stack_fffffffffffff570,1);
                  local_1e0 = in_stack_fffffffffffff584 *
                              (in_stack_fffffffffffff580 + (iVar10 - iVar6) * iVar9) + local_1e0;
                  in_stack_fffffffffffff588[local_1e0] = -1;
                }
              }
              else {
                pBVar17 = amrex::BaseFab<int>::box(local_600);
                pIVar18 = amrex::BoxIterator::operator()(&local_7ac);
                bVar5 = amrex::Box::contains(pBVar17,pIVar18);
                pBVar4 = local_600;
                if (bVar5) {
                  local_310 = amrex::BoxIterator::operator()(&local_7ac);
                  local_308 = pBVar4;
                  piVar19 = pBVar4->dptr;
                  pBVar17 = &pBVar4->domain;
                  local_fc = 0;
                  local_10c = 0;
                  local_168 = (long)(local_310->vect[0] - (pBVar17->smallend).vect[0]);
                  local_160 = local_310;
                  local_158 = pBVar17;
                  local_108 = pBVar17;
                  local_f8 = local_310;
                  in_stack_fffffffffffff554 = amrex::Box::length(pBVar17,0);
                  local_118 = local_160;
                  local_11c = 1;
                  local_12c = 1;
                  in_stack_fffffffffffff550 = local_160->vect[1] - (pBVar17->smallend).vect[1];
                  local_138 = local_160;
                  local_13c = 2;
                  local_14c = 2;
                  in_stack_fffffffffffff54c = local_160->vect[2] - (pBVar17->smallend).vect[2];
                  local_148 = pBVar17;
                  local_128 = pBVar17;
                  iVar10 = amrex::Box::length(pBVar17,1);
                  local_168 = in_stack_fffffffffffff554 *
                              (in_stack_fffffffffffff550 + in_stack_fffffffffffff54c * iVar10) +
                              local_168;
                  piVar19[local_168] = 2;
                }
              }
            }
          }
          else {
            pBVar17 = amrex::BaseFab<int>::box(local_600);
            pIVar18 = amrex::BoxIterator::operator()(&local_7ac);
            bVar5 = amrex::Box::contains(pBVar17,pIVar18);
            pBVar4 = local_600;
            if (bVar5) {
              local_2e0 = amrex::BoxIterator::operator()(&local_7ac);
              local_2d8 = pBVar4;
              piVar19 = pBVar4->dptr;
              pBVar17 = &pBVar4->domain;
              local_264 = 0;
              local_274 = 0;
              local_2d0 = (long)(local_2e0->vect[0] - (pBVar17->smallend).vect[0]);
              local_2c8 = local_2e0;
              local_2c0 = pBVar17;
              local_270 = pBVar17;
              local_260 = local_2e0;
              iVar7 = amrex::Box::length(pBVar17,0);
              local_280 = local_2c8;
              local_284 = 1;
              iVar10 = local_2c8->vect[1];
              local_294 = 1;
              iVar6 = (pBVar4->domain).smallend.vect[1];
              local_2a0 = local_2c8;
              local_2a4 = 2;
              iVar9 = local_2c8->vect[2];
              local_2b4 = 2;
              iVar1 = (pBVar4->domain).smallend.vect[2];
              local_2b0 = pBVar17;
              local_290 = pBVar17;
              iVar8 = amrex::Box::length(pBVar17,1);
              local_2d0 = iVar7 * ((iVar10 - iVar6) + (iVar9 - iVar1) * iVar8) + local_2d0;
              piVar19[local_2d0] = 0;
            }
          }
          amrex::BoxIterator::operator++((BoxIterator *)0x49e018);
        }
        local_5f4 = 8;
        amrex::BoxIterator::~BoxIterator(&local_7ac);
      }
      else {
        in_stack_fffffffffffff530 = (Box *)amrex::OutStream();
        amrex::Print::Print((Print *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                            (ostream *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548)
                           );
        in_stack_fffffffffffff528 =
             amrex::Print::operator<<((Print *)in_stack_fffffffffffff520,(char (*) [34])mfi_00);
        amrex::Print::operator<<
                  ((Print *)in_stack_fffffffffffff520,
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)mfi_00);
        amrex::Print::~Print(in_stack_fffffffffffff590);
        local_378 = 0;
        amrex::Abort_host((char *)in_stack_fffffffffffff530);
      }
      amrex::MFIter::operator++(&local_5f0);
    }
    local_5f4 = 2;
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff520);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::initialize_eb2_structs() {

  amrex::Print() << "Initializing EB2 structs" << std::endl;

  // NOTE: THIS NEEDS TO BE REPLACED WITH A FLAGFAB 
  
  // n.b., could set this to 1 if geometry is all_regular as an optimization
  no_eb_in_domain = 0;

  //  1->regular, 0->irregular, -1->covered, 2->outside
  ebmask.define(grids, dmap,  1, 0);
  
  const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());

  // These are the data sources
  volfrac = &(ebfactory.getVolFrac());
  bndrycent = &(ebfactory.getBndryCent());
  areafrac = ebfactory.getAreaFrac();
  facecent = ebfactory.getFaceCent();
  
  auto const& flags = ebfactory.getMultiEBCellFlagFab();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  for (MFIter mfi(*volfrac, false); mfi.isValid(); ++mfi)
  {
    BaseFab<int>& mfab = ebmask[mfi];
    const Box tbox = mfi.growntilebox();
    const Box bx = mfi.tilebox();
    const EBCellFlagFab& flagfab = flags[mfi];
    
    FabType typ = flagfab.getType(tbox);

    if (typ == FabType::regular) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = 1;
      });
    }
    else if (typ == FabType::covered) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = -1;
      });
    }
    else if (typ == FabType::singlevalued) {
      int Ncut = 0;
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          Ncut++;
        }
      }
    
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          if (mfab.box().contains(bit())) mfab(bit()) = 0;
        } else {
          if (flag.isRegular()) {
            if (mfab.box().contains(bit())) mfab(bit()) = 1;
          } else if (flag.isCovered()) {
            if (mfab.box().contains(bit())) mfab(bit()) = -1;
          } else {
            if (mfab.box().contains(bit())) mfab(bit()) = 2;
          }
        }
      }
    }
    else {
      amrex::Print() << "unknown (or multivalued) fab type" << std::endl;
      amrex::Abort();
    }   
  }
}